

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# std.cpp
# Opt level: O3

int t3_compare_case_fold_min(utf8_ptr *a,size_t *alen,wchar_t **b,size_t *blen)

{
  wchar_t wVar1;
  wchar_t wVar2;
  long lVar3;
  int iVar4;
  CVmCaseFoldStr bp;
  Utf8FoldStr ap;
  CVmCaseFoldStr local_80;
  Utf8FoldStr local_58;
  
  local_58.rem = *alen;
  local_80.rem = *blen;
  if (local_80.rem == 0 || local_58.rem == 0) {
    iVar4 = (int)local_58.rem - (int)local_80.rem;
  }
  else {
    local_58.p = (utf8_ptr)a->p_;
    local_58.fpbase = local_58.ie;
    local_58.fp = local_58.ie + 1;
    local_58.ie[1] = L'\0';
    local_80.p = *b;
    local_80.fpbase = local_80.ie;
    local_80.fp = local_80.ie + 1;
    local_80.ie[1] = L'\0';
    wVar1 = Utf8FoldStr::getch(&local_58);
    wVar2 = CVmCaseFoldStr::getch(&local_80);
    if (wVar1 == wVar2) {
      do {
        if ((((local_58.fp != local_58.fpbase) && (*local_58.fp == L'\0')) &&
            (local_80.fp != local_80.fpbase)) && (*local_80.fp == L'\0')) {
          lVar3 = (long)local_58.p.p_ - (long)a->p_;
          *alen = *alen - lVar3;
          a->p_ = a->p_ + lVar3;
          *blen = *blen - ((long)local_80.p - (long)*b >> 2);
          *b = local_80.p;
          return 0;
        }
        wVar1 = Utf8FoldStr::getch(&local_58);
        wVar2 = CVmCaseFoldStr::getch(&local_80);
      } while (wVar1 == wVar2);
    }
    iVar4 = wVar1 - wVar2;
  }
  return iVar4;
}

Assistant:

int t3_compare_case_fold_min(
    utf8_ptr &a, size_t &alen, const wchar_t *&b, size_t &blen)
{
    /* if either is empty, there can be no match (unless both are empty) */
    if (alen == 0 || blen == 0)
        return alen - blen;

    /* set up folded-case string readers for the two strings */
    Utf8FoldStr ap(a.getptr(), alen);
    CVmCaseFoldStr bp(b, blen);

    /* 
     *   Scan until we're at a boundary in both strings.  Note that we start
     *   at a boundary, so always compare at least one character. 
     */
    do
    {
        /* get the next character of each string */
        wchar_t ach = ap.getch(), bch = bp.getch();

        /* if they're different, return the sign difference */
        if (ach != bch)
            return ach - bch;
    }
    while (!ap.at_boundary() || !bp.at_boundary());

    /* 
     *   If we made it to a boundary in each string without finding a
     *   difference, we have a match.  Advance each string past the matched
     *   text.
     */
    size_t ainc = ap.getptr() - a.getptr();
    alen -= ainc;
    a.inc_bytes(ainc);

    blen -= bp.getptr() - b;
    b = bp.getptr();

    /* return "equal" */
    return 0;
}